

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vnode.c
# Opt level: O0

int evfilt_vnode_copyout(kevent *dst,int nevents,filter *filt,knote *src,void *ptr)

{
  int iVar1;
  int *piVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDI;
  stat_conflict sb;
  inotify_event *evt;
  uint8_t buf [272];
  knote *in_stack_fffffffffffffe28;
  filter *in_stack_fffffffffffffe30;
  undefined4 local_1c8;
  int in_stack_fffffffffffffe3c;
  size_t in_stack_fffffffffffffe40;
  inotify_event *in_stack_fffffffffffffe48;
  long local_1a8;
  uint local_13c;
  int local_4;
  
  iVar1 = get_one_event(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                        in_stack_fffffffffffffe3c);
  if (iVar1 < 0) {
    local_4 = -1;
  }
  else if ((local_13c & 0x8000) == 0) {
    if (((local_13c & 8) == 0) && ((local_13c & 0x10) == 0)) {
      *in_RDI = *in_RCX;
      in_RDI[1] = in_RCX[1];
      in_RDI[2] = in_RCX[2];
      in_RDI[3] = in_RCX[3];
      in_RDI[2] = 0;
      *(undefined4 *)((long)in_RDI + 0xc) = 0;
      iVar1 = fstat((int)*in_RCX,(stat *)&stack0xfffffffffffffe28);
      if ((iVar1 < 0) && (piVar2 = __errno_location(), *piVar2 == 2)) {
        if ((*(uint *)((long)in_RCX + 0xc) & 1) != 0) {
          *(uint *)((long)in_RDI + 0xc) = *(uint *)((long)in_RDI + 0xc) | 1;
        }
      }
      else if (((local_13c & 4) != 0) || ((local_13c & 2) != 0)) {
        if ((CONCAT44(in_stack_fffffffffffffe3c,local_1c8) == 0) &&
           ((*(uint *)((long)in_RCX + 0xc) & 1) != 0)) {
          *(uint *)((long)in_RDI + 0xc) = *(uint *)((long)in_RDI + 0xc) | 1;
        }
        if ((CONCAT44(in_stack_fffffffffffffe3c,local_1c8) != in_RCX[0x10]) &&
           ((*(uint *)((long)in_RCX + 0xc) & 0x10) != 0)) {
          *(uint *)((long)in_RDI + 0xc) = *(uint *)((long)in_RDI + 0xc) | 0x10;
        }
        if (((long)in_RCX[0x11] < local_1a8) && ((*(uint *)((long)in_RCX + 0xc) & 2) != 0)) {
          *(uint *)((long)in_RDI + 0xc) = *(uint *)((long)in_RDI + 0xc) | 4;
        }
        in_RCX[0x10] = CONCAT44(in_stack_fffffffffffffe3c,local_1c8);
        in_RCX[0x11] = local_1a8;
      }
      if (((local_13c & 2) != 0) && ((*(uint *)((long)in_RCX + 0xc) & 2) != 0)) {
        *(uint *)((long)in_RDI + 0xc) = *(uint *)((long)in_RDI + 0xc) | 2;
      }
      if (((local_13c & 4) != 0) && ((*(uint *)((long)in_RCX + 0xc) & 8) != 0)) {
        *(uint *)((long)in_RDI + 0xc) = *(uint *)((long)in_RDI + 0xc) | 8;
      }
      if (((local_13c & 0x800) != 0) && ((*(uint *)((long)in_RCX + 0xc) & 0x20) != 0)) {
        *(uint *)((long)in_RDI + 0xc) = *(uint *)((long)in_RDI + 0xc) | 0x20;
      }
      if (((local_13c & 0x400) != 0) && ((*(uint *)((long)in_RCX + 0xc) & 1) != 0)) {
        *(uint *)((long)in_RDI + 0xc) = *(uint *)((long)in_RDI + 0xc) | 1;
      }
      iVar1 = knote_copyout_flag_actions(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      if (iVar1 < 0) {
        local_4 = -1;
      }
      else {
        local_4 = 1;
      }
    }
    else {
      *(ushort *)((long)in_RCX + 10) = *(ushort *)((long)in_RCX + 10) | 0x10;
      *(undefined2 *)(in_RDI + 1) = 0;
      local_4 = 0;
    }
  }
  else {
    *(undefined2 *)(in_RDI + 1) = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
evfilt_vnode_copyout(struct kevent *dst, UNUSED int nevents, struct filter *filt,
    struct knote *src, void *ptr UNUSED)
{
    uint8_t buf[sizeof(struct inotify_event) + NAME_MAX + 1] __attribute__ ((aligned(__alignof__(struct inotify_event))));
    struct inotify_event *evt;
    struct stat sb;

    evt = (struct inotify_event *)buf;
    if (get_one_event(evt, sizeof(buf), src->kn_vnode.inotifyfd) < 0)
        return (-1);

    dbg_printf("inotify event: %s", inotify_event_dump(evt));
    if (evt->mask & IN_IGNORED) {
        /* TODO: possibly return error when fs is unmounted */
        dst->filter = 0;
        return (0);
    }

    /* Check if the watched file has been closed, and
       XXX-this may not exactly match the kevent() behavior if multiple file de
scriptors reference the same file.
    */
    if (evt->mask & IN_CLOSE_WRITE || evt->mask & IN_CLOSE_NOWRITE) {
        src->kev.flags |= EV_ONESHOT; /* KLUDGE: causes the knote to be deleted */
        dst->filter = 0; /* KLUDGE: causes the event to be discarded */
        return (0);
    }

    memcpy(dst, &src->kev, sizeof(*dst));
    dst->data = 0;
    dst->fflags = 0;

    /* No error checking because fstat(2) should rarely fail */
    //FIXME: EINTR
    if (fstat(src->kev.ident, &sb) < 0 && errno == ENOENT) {
        if (src->kev.fflags & NOTE_DELETE)
            dst->fflags |= NOTE_DELETE;
    } else {
        if ((evt->mask & IN_ATTRIB || evt->mask & IN_MODIFY)) {
            if (sb.st_nlink == 0 && src->kev.fflags & NOTE_DELETE)
                dst->fflags |= NOTE_DELETE;
            if (sb.st_nlink != src->kn_vnode.nlink &&
                src->kev.fflags & NOTE_LINK)
                dst->fflags |= NOTE_LINK;
#if HAVE_NOTE_TRUNCATE
            if (sb.st_nsize == 0 && src->kev.fflags & NOTE_TRUNCATE)
                dst->fflags |= NOTE_TRUNCATE;
#endif
            if (sb.st_size > src->kn_vnode.size &&
                src->kev.fflags & NOTE_WRITE)
                dst->fflags |= NOTE_EXTEND;
            src->kn_vnode.nlink = sb.st_nlink;
            src->kn_vnode.size = sb.st_size;
        }
    }

    if (evt->mask & IN_MODIFY && src->kev.fflags & NOTE_WRITE)
        dst->fflags |= NOTE_WRITE;
    if (evt->mask & IN_ATTRIB && src->kev.fflags & NOTE_ATTRIB)
        dst->fflags |= NOTE_ATTRIB;
    if (evt->mask & IN_MOVE_SELF && src->kev.fflags & NOTE_RENAME)
        dst->fflags |= NOTE_RENAME;
    if (evt->mask & IN_DELETE_SELF && src->kev.fflags & NOTE_DELETE)
        dst->fflags |= NOTE_DELETE;

    if (knote_copyout_flag_actions(filt, src) < 0) return -1;

    return (1);
}